

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# localintermediate.h
# Opt level: O0

void __thiscall glslang::TIntermediate::setEntryPointName(TIntermediate *this,char *ep)

{
  char *ep_local;
  TIntermediate *this_local;
  
  std::__cxx11::string::operator=((string *)&this->entryPointName,ep);
  TProcesses::addProcess(&this->processes,"entry-point");
  TProcesses::addArgument(&this->processes,&this->entryPointName);
  return;
}

Assistant:

void setEntryPointName(const char* ep)
    {
        entryPointName = ep;
        processes.addProcess("entry-point");
        processes.addArgument(entryPointName);
    }